

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

int Bac_ManClpObjNum_rec(Bac_Ntk_t *p)

{
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  Bac_Ntk_t *p_00;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  
  iVar13 = p->Count;
  if (iVar13 < 0) {
    uVar10 = (p->vType).nSize;
    uVar7 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      iVar13 = 0;
    }
    else {
      lVar16 = 0;
      iVar17 = -1;
      iVar14 = 1;
      lVar15 = 1;
      lVar9 = 0;
      iVar13 = 0;
      do {
        pcVar3 = (p->vType).pArray;
        bVar2 = pcVar3[lVar9];
        uVar10 = (bVar2 >> 1) - 0x49;
        if (0xffffffbb < uVar10) {
          if ((bVar2 & 0xfe) == 10) {
            if (bVar2 < 10) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar5 = (p->vFanin).pArray[lVar9];
            if (((long)iVar5 < 1) || (p->pDesign->nNtks < iVar5)) {
              p_00 = (Bac_Ntk_t *)0x0;
            }
            else {
              p_00 = p->pDesign->pNtks + iVar5;
            }
            iVar6 = Bac_ManClpObjNum_rec(p_00);
            iVar5 = (p->vType).nSize;
            if (iVar5 <= lVar9) {
LAB_0038b6f2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pcVar3 = (p->vType).pArray;
            if (((byte)pcVar3[lVar9] >> 1) - 0x49 < 0xffffffbc) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
            }
            uVar10 = iVar5 - 1;
            lVar11 = 0;
            do {
              if (lVar16 + (ulong)uVar10 == lVar11) goto LAB_0038b6b1;
              lVar4 = lVar11 + lVar15;
              lVar11 = lVar11 + 1;
            } while ((pcVar3[lVar4] & 0xfeU) == 8);
            uVar10 = (int)lVar11 - iVar14;
LAB_0038b6b1:
            iVar6 = (uVar10 - (int)lVar9) * 3 + iVar6;
          }
          else {
            if (uVar10 < 0xffffffbc) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
            }
            iVar5 = (int)uVar7;
            lVar11 = lVar9;
            do {
              if (lVar11 < 1) {
                iVar8 = 1;
                goto LAB_0038b62b;
              }
              if (iVar5 < lVar9) goto LAB_0038b6f2;
              lVar4 = lVar11 + -1;
              lVar11 = lVar11 + -1;
            } while ((pcVar3[lVar4] & 0xfeU) == 6);
            iVar8 = -(int)lVar11;
LAB_0038b62b:
            lVar11 = lVar15;
            iVar12 = iVar17;
            do {
              iVar6 = iVar5 + -1;
              if (iVar5 <= lVar11) break;
              pbVar1 = (byte *)(pcVar3 + lVar11);
              iVar12 = iVar12 + 1;
              lVar11 = lVar11 + 1;
              iVar6 = iVar12;
            } while ((*pbVar1 & 0xfe) == 8);
            iVar6 = iVar6 + iVar8;
          }
          iVar13 = iVar13 + iVar6;
        }
        lVar9 = lVar9 + 1;
        uVar7 = (ulong)(p->vType).nSize;
        iVar17 = iVar17 + 1;
        lVar15 = lVar15 + 1;
        iVar14 = iVar14 + -1;
        lVar16 = lVar16 + -1;
      } while (lVar9 < (long)uVar7);
    }
    p->Count = iVar13;
  }
  return iVar13;
}

Assistant:

int Bac_ManClpObjNum_rec( Bac_Ntk_t * p )
{
    int i, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, i )
        Counter += Bac_ObjIsBoxUser(p, i) ? Bac_ManClpObjNum_rec( Bac_BoxNtk(p, i) ) + 3*Bac_BoxBoNum(p, i) : Bac_BoxSize(p, i);
    return (p->Count = Counter);
}